

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void do_incognito(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  char *format;
  char *txt;
  char arg [4608];
  char local_1218 [4608];
  
  one_argument(argument,local_1218);
  if (local_1218[0] == '\0') {
    if (ch->incog_level == 0) {
      iVar1 = get_trust(ch);
      ch->incog_level = (short)iVar1;
      goto LAB_002758e3;
    }
    ch->incog_level = 0;
    txt = "You are no longer cloaked.\n\r";
    format = "$n is no longer cloaked.";
  }
  else {
    iVar1 = atoi(local_1218);
    txt = "Incog level must be between 2 and your level.\n\r";
    if (iVar1 < 2) goto LAB_00275900;
    iVar2 = get_trust(ch);
    if (iVar2 < iVar1) goto LAB_00275900;
    ch->reply = (CHAR_DATA *)0x0;
    ch->incog_level = (short)iVar1;
LAB_002758e3:
    txt = "You cloak your presence.\n\r";
    format = "$n cloaks $s presence.";
  }
  act(format,ch,(void *)0x0,(void *)0x0,0);
LAB_00275900:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_incognito(CHAR_DATA *ch, char *argument)
{
	int level;
	char arg[MAX_STRING_LENGTH];

	/* RT code for taking a level argument */
	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		/* take the default path */

		if (ch->incog_level)
		{
			ch->incog_level = 0;
			act("$n is no longer cloaked.", ch, nullptr, nullptr, TO_ROOM);
			send_to_char("You are no longer cloaked.\n\r", ch);
		}
		else
		{
			ch->incog_level = get_trust(ch);
			act("$n cloaks $s presence.", ch, nullptr, nullptr, TO_ROOM);
			send_to_char("You cloak your presence.\n\r", ch);
		}
	}
	else
	{
		/* do the level thing */
		level = atoi(arg);

		if (level < 2 || level > get_trust(ch))
		{
			send_to_char("Incog level must be between 2 and your level.\n\r", ch);
			return;
		}
		else
		{
			ch->reply = nullptr;
			ch->incog_level = level;
			act("$n cloaks $s presence.", ch, nullptr, nullptr, TO_ROOM);
			send_to_char("You cloak your presence.\n\r", ch);
		}
	}
}